

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaParticlePtr xmlSchemaAddParticle(void)

{
  xmlSchemaParticlePtr pxVar1;
  
  pxVar1 = (xmlSchemaParticlePtr)(*xmlMalloc)(0x30);
  if (pxVar1 == (xmlSchemaParticlePtr)0x0) {
    pxVar1 = (xmlSchemaParticlePtr)0x0;
    __xmlSimpleError(0xf,2,(xmlNodePtr)0x0,(char *)0x0,"allocating particle component");
  }
  else {
    *(undefined8 *)pxVar1 = 0;
    pxVar1->annot = (xmlSchemaAnnotPtr)0x0;
    pxVar1->minOccurs = 0;
    pxVar1->maxOccurs = 0;
    pxVar1->node = (xmlNodePtr)0x0;
    pxVar1->next = (xmlSchemaTreeItemPtr_conflict)0x0;
    pxVar1->children = (xmlSchemaTreeItemPtr_conflict)0x0;
    pxVar1->type = XML_SCHEMA_TYPE_PARTICLE;
    pxVar1->minOccurs = 1;
    pxVar1->maxOccurs = 1;
  }
  return pxVar1;
}

Assistant:

static xmlSchemaParticlePtr
xmlSchemaAddParticle(xmlSchemaParserCtxtPtr ctxt,
		     xmlNodePtr node, int min, int max)
{
    xmlSchemaParticlePtr ret = NULL;
    if (ctxt == NULL)
        return (NULL);

#ifdef DEBUG
    fprintf(stderr, "Adding particle component\n");
#endif
    ret = (xmlSchemaParticlePtr)
	xmlMalloc(sizeof(xmlSchemaParticle));
    if (ret == NULL) {
	xmlSchemaPErrMemory(ctxt, "allocating particle component",
	    NULL);
	return (NULL);
    }
    ret->type = XML_SCHEMA_TYPE_PARTICLE;
    ret->annot = NULL;
    ret->node = node;
    ret->minOccurs = min;
    ret->maxOccurs = max;
    ret->next = NULL;
    ret->children = NULL;

    WXS_ADD_LOCAL(ctxt, ret);
    /*
    * Note that addition to pending components will be done locally
    * to the specific parsing function, since the most particles
    * need not to be fixed up (i.e. the reference to be resolved).
    * REMOVED: WXS_ADD_PENDING(ctxt, ret);
    */
    return (ret);
}